

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::RecordLegacyImportLocation
          (LocationRecorder *this,Message *descriptor,string *name)

{
  SourceLocationTable *this_00;
  int32_t line;
  int32_t column;
  
  this_00 = this->parser_->source_location_table_;
  if (this_00 != (SourceLocationTable *)0x0) {
    line = SourceCodeInfo_Location::_internal_span(this->location_,0);
    column = SourceCodeInfo_Location::_internal_span(this->location_,1);
    SourceLocationTable::AddImport(this_00,descriptor,name,line,column);
    return;
  }
  return;
}

Assistant:

void Parser::LocationRecorder::RecordLegacyImportLocation(
    const Message* descriptor, const std::string& name) {
  if (parser_->source_location_table_ != nullptr) {
    parser_->source_location_table_->AddImport(
        descriptor, name, location_->span(0), location_->span(1));
  }
}